

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClusterList.h
# Opt level: O1

void __thiscall
SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U>::Merge
          (SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U> *this,uint a,uint b)

{
  uint uVar1;
  uint **ppuVar2;
  uint uVar3;
  uint uVar4;
  
  if (a == b) {
    return;
  }
  if (a < this->maxIndex) {
    uVar3 = a >> 4;
    if (this->backingStore[uVar3] == (uint *)0x0) goto LAB_003f601e;
    uVar4 = a & 0xf;
    uVar1 = this->backingStore[uVar3][uVar4];
    if (uVar1 != a) {
      a = SegmentClusterList<unsigned_int,Memory::JitArenaAllocator,16u>::Lookup<false,false>
                    ((SegmentClusterList<unsigned_int,Memory::JitArenaAllocator,16u> *)this,uVar1);
      this->backingStore[uVar3][uVar4] = a;
    }
  }
  else {
LAB_003f601e:
    CreateBacking(this,a);
  }
  if (b < this->maxIndex) {
    uVar3 = b >> 4;
    if (this->backingStore[uVar3] != (uint *)0x0) {
      uVar4 = b & 0xf;
      uVar1 = this->backingStore[uVar3][uVar4];
      if (uVar1 != b) {
        b = SegmentClusterList<unsigned_int,Memory::JitArenaAllocator,16u>::Lookup<false,false>
                      ((SegmentClusterList<unsigned_int,Memory::JitArenaAllocator,16u> *)this,uVar1)
        ;
        this->backingStore[uVar3][uVar4] = b;
      }
      goto LAB_003f6076;
    }
  }
  CreateBacking(this,b);
LAB_003f6076:
  uVar3 = b;
  if (a < b) {
    uVar3 = a;
  }
  if ((this->maxIndex <= a) || (this->backingStore[a >> 4] == (uint *)0x0)) {
    CreateBacking(this,a);
  }
  ppuVar2 = this->backingStore;
  ppuVar2[a >> 4][a & 0xf] = uVar3;
  if ((this->maxIndex <= b) || (ppuVar2[b >> 4] == (uint *)0x0)) {
    CreateBacking(this,b);
  }
  this->backingStore[b >> 4][b & 0xf] = uVar3;
  if (a != b) {
    this->consolidated = false;
  }
  return;
}

Assistant:

void Merge(indexType a, indexType b)
    {
        if (a == b)
            return;
        indexType aVal = Lookup<true>(a);
        indexType bVal = Lookup<true>(b);
        indexType min = (aVal < bVal ? aVal : bVal);
        // We need to update the roots of both branches to point to the min
        Assign<false>(aVal, min);
        Assign<false>(bVal, min);
#if DBG
        if(aVal != min || bVal != min)
            consolidated = false;
#endif
    }